

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav_read_pcm_frames_le(ma_dr_wav *pWav,ma_uint64 framesToRead,void *pBufferOut)

{
  ma_uint32 mVar1;
  ulong uVar2;
  size_t sVar3;
  ulong in_RSI;
  ma_dr_wav *in_RDI;
  ma_uint64 framesRemainingInFile;
  ma_uint64 bytesToRead;
  ma_uint32 bytesPerFrame;
  void *in_stack_00000fd8;
  size_t in_stack_00000fe0;
  ma_dr_wav *in_stack_00000fe8;
  ulong local_20;
  ulong local_10;
  
  if ((in_RDI == (ma_dr_wav *)0x0) || (in_RSI == 0)) {
    local_10 = 0;
  }
  else if (in_RDI->translatedFormatTag == 2 || in_RDI->translatedFormatTag == 0x11) {
    local_10 = 0;
  }
  else {
    uVar2 = in_RDI->totalPCMFrameCount - in_RDI->readCursorInPCMFrames;
    local_20 = in_RSI;
    if (uVar2 < in_RSI) {
      local_20 = uVar2;
    }
    mVar1 = ma_dr_wav_get_bytes_per_pcm_frame(in_RDI);
    if (mVar1 == 0) {
      local_10 = 0;
    }
    else if (local_20 * mVar1 == 0) {
      local_10 = 0;
    }
    else {
      sVar3 = ma_dr_wav_read_raw(in_stack_00000fe8,in_stack_00000fe0,in_stack_00000fd8);
      local_10 = sVar3 / mVar1;
    }
  }
  return local_10;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_le(ma_dr_wav* pWav, ma_uint64 framesToRead, void* pBufferOut)
{
    ma_uint32 bytesPerFrame;
    ma_uint64 bytesToRead;
    ma_uint64 framesRemainingInFile;
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (ma_dr_wav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        return 0;
    }
    framesRemainingInFile = pWav->totalPCMFrameCount - pWav->readCursorInPCMFrames;
    if (framesToRead > framesRemainingInFile) {
        framesToRead = framesRemainingInFile;
    }
    bytesPerFrame = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }
    bytesToRead = framesToRead * bytesPerFrame;
    if (bytesToRead > MA_SIZE_MAX) {
        bytesToRead = (MA_SIZE_MAX / bytesPerFrame) * bytesPerFrame;
    }
    if (bytesToRead == 0) {
        return 0;
    }
    return ma_dr_wav_read_raw(pWav, (size_t)bytesToRead, pBufferOut) / bytesPerFrame;
}